

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::DOMNodeImpl::lookupPrefix
          (DOMNodeImpl *this,XMLCh *namespaceURI,DOMElement *originalElement)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  DOMNode *pDVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar6;
  DOMNode *pDVar7;
  long *plVar8;
  XMLCh *pXVar9;
  XMLCh *str1;
  XMLCh *str1_00;
  undefined4 extraout_var_03;
  DOMNodeImpl *this_00;
  DOMNode *ancestor;
  XMLCh *foundNamespace_1;
  XMLCh *localname;
  XMLCh *value;
  XMLCh *attrPrefix;
  DOMNode *attr;
  XMLSize_t i;
  XMLSize_t length;
  DOMNamedNodeMap *nodeMap;
  XMLCh *foundNamespace;
  XMLCh *prefix;
  XMLCh *ns;
  DOMNode *thisNode;
  DOMElement *originalElement_local;
  XMLCh *namespaceURI_local;
  DOMNodeImpl *this_local;
  undefined4 extraout_var_02;
  
  pDVar5 = getContainingNode(this);
  iVar2 = (*pDVar5->_vptr_DOMNode[0x16])();
  iVar3 = (*pDVar5->_vptr_DOMNode[0x17])();
  pXVar9 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
  if ((((XMLCh *)CONCAT44(extraout_var,iVar2) != (XMLCh *)0x0) &&
      (bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar2),namespaceURI), bVar1)) &&
     (pXVar9 != (XMLCh *)0x0)) {
    iVar2 = (*(originalElement->super_DOMNode)._vptr_DOMNode[0x25])(originalElement,pXVar9);
    if (((XMLCh *)CONCAT44(extraout_var_01,iVar2) != (XMLCh *)0x0) &&
       (bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar2),namespaceURI), bVar1)) {
      return pXVar9;
    }
  }
  uVar4 = (*pDVar5->_vptr_DOMNode[0x1a])();
  if ((uVar4 & 1) != 0) {
    iVar2 = (*pDVar5->_vptr_DOMNode[0xb])();
    plVar6 = (long *)CONCAT44(extraout_var_02,iVar2);
    if (plVar6 != (long *)0x0) {
      pDVar7 = (DOMNode *)(**(code **)(*plVar6 + 0x28))();
      for (attr = (DOMNode *)0x0; attr < pDVar7; attr = (DOMNode *)((long)&attr->_vptr_DOMNode + 1))
      {
        plVar8 = (long *)(**(code **)(*plVar6 + 0x18))(plVar6,attr);
        pXVar9 = (XMLCh *)(**(code **)(*plVar8 + 0xb8))();
        str1 = (XMLCh *)(**(code **)(*plVar8 + 0x18))();
        str1_00 = (XMLCh *)(**(code **)(*plVar8 + 0xb0))();
        if (((str1_00 != (XMLCh *)0x0) &&
            (bVar1 = XMLString::equals(str1_00,(XMLCh *)XMLUni::fgXMLNSURIName), bVar1)) &&
           ((pXVar9 != (XMLCh *)0x0 &&
            ((bVar1 = XMLString::equals(pXVar9,(XMLCh *)XMLUni::fgXMLNSString), bVar1 &&
             (bVar1 = XMLString::equals(str1,namespaceURI), bVar1)))))) {
          pXVar9 = (XMLCh *)(**(code **)(*plVar8 + 0xc0))();
          iVar2 = (*(originalElement->super_DOMNode)._vptr_DOMNode[0x25])(originalElement,pXVar9);
          if (((XMLCh *)CONCAT44(extraout_var_03,iVar2) != (XMLCh *)0x0) &&
             (bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_03,iVar2),namespaceURI),
             bVar1)) {
            return pXVar9;
          }
        }
      }
    }
  }
  pDVar5 = getElementAncestor(this,pDVar5);
  if (pDVar5 == (DOMNode *)0x0) {
    this_local = (DOMNodeImpl *)0x0;
  }
  else {
    this_00 = xercesc_4_0::castToNodeImpl(pDVar5);
    this_local = (DOMNodeImpl *)lookupPrefix(this_00,namespaceURI,originalElement);
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* DOMNodeImpl::lookupPrefix(const XMLCh* const namespaceURI, DOMElement *originalElement) const {
    const DOMNode *thisNode = getContainingNode();

    const XMLCh* ns = thisNode->getNamespaceURI();
    // REVISIT: if no prefix is available is it null or empty string, or
    //          could be both?
    const XMLCh* prefix = thisNode->getPrefix();

    if (ns != 0 && XMLString::equals(ns,namespaceURI) && prefix != 0) {
        const XMLCh* foundNamespace =  originalElement->lookupNamespaceURI(prefix);
        if (foundNamespace != 0 && XMLString::equals(foundNamespace, namespaceURI)) {
            return prefix;
        }
    }
    if (thisNode->hasAttributes()) {
        DOMNamedNodeMap *nodeMap = thisNode->getAttributes();

        if(nodeMap != 0) {
            XMLSize_t length = nodeMap->getLength();

            for (XMLSize_t i = 0;i < length;i++) {
                DOMNode *attr = nodeMap->item(i);
                const XMLCh* attrPrefix = attr->getPrefix();
                const XMLCh* value = attr->getNodeValue();

                ns = attr->getNamespaceURI();

                if (ns != 0 && XMLString::equals(ns, XMLUni::fgXMLNSURIName)) {
                    // DOM Level 2 nodes
                    if ((attrPrefix != 0 && XMLString::equals(attrPrefix, XMLUni::fgXMLNSString)) &&
                        XMLString::equals(value, namespaceURI)) {
                        const XMLCh* localname= attr->getLocalName();
                        const XMLCh* foundNamespace = originalElement->lookupNamespaceURI(localname);
                        if (foundNamespace != 0 && XMLString::equals(foundNamespace, namespaceURI)) {
                            return localname;
                        }
                    }
                }
            }
        }
    }
    DOMNode *ancestor = getElementAncestor(thisNode);
    if (ancestor != 0) {
        return castToNodeImpl(ancestor)->lookupPrefix(namespaceURI, originalElement);
    }
    return 0;
}